

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void process_player_input(tgestate_t *state)

{
  input_t iVar1;
  tgestate_t *in_RDI;
  input_t input;
  int in_stack_ffffffffffffffe8;
  input_t in_stack_ffffffffffffffec;
  room_t room_index;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_RDI->in_solitary == '\0') && (in_RDI->morale_exhausted == '\0')) {
    if ((in_RDI->vischars[0].flags & 3) == 0) {
      iVar1 = input_routine((tgestate_t *)0x1093f6);
      if (iVar1 == 0) {
        if (in_RDI->automatic_player_counter == '\0') {
          return;
        }
        in_RDI->automatic_player_counter = in_RDI->automatic_player_counter + 0xff;
        iVar1 = 0;
      }
      else {
        in_RDI->automatic_player_counter = '\x1f';
        if ((in_RDI->hero_in_bed != '\0') || (in_RDI->hero_in_breakfast != '\0')) {
          room_index = (room_t)(in_stack_ffffffffffffffec >> 0x18);
          if (in_RDI->hero_in_bed == '\0') {
            in_RDI->vischars[0].route.index = '+';
            in_RDI->vischars[0].route.step = '\0';
            in_RDI->vischars[0].mi.mappos.u = 0x34;
            in_RDI->vischars[0].mi.mappos.v = 0x3e;
            set_roomdef((tgestate_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0),room_index,
                        in_stack_ffffffffffffffe8,0);
            in_RDI->hero_in_breakfast = '\0';
          }
          else {
            in_RDI->vischars[0].route.index = ',';
            in_RDI->vischars[0].route.step = '\x01';
            in_RDI->vischars[0].target.u = '.';
            in_RDI->vischars[0].target.v = '.';
            in_RDI->vischars[0].mi.mappos.u = 0x2e;
            in_RDI->vischars[0].mi.mappos.v = 0x2e;
            in_RDI->vischars[0].mi.mappos.w = 0x18;
            set_roomdef((tgestate_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0),room_index,
                        in_stack_ffffffffffffffe8,0);
            in_RDI->hero_in_bed = '\0';
          }
          setup_room(state);
          plot_interior_tiles(in_RDI);
        }
        if (8 < iVar1) {
          process_player_input_fire
                    ((tgestate_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffec);
          iVar1 = 0x80;
        }
      }
      if (in_RDI->vischars[0].input != iVar1) {
        in_RDI->vischars[0].input = (byte)iVar1 | 0x80;
      }
    }
    else {
      in_RDI->automatic_player_counter = '\x1f';
      if (in_RDI->vischars[0].flags == '\x01') {
        picking_lock((tgestate_t *)0x1093db);
      }
      else {
        cutting_wire(in_RDI);
      }
    }
  }
  return;
}

Assistant:

void process_player_input(tgestate_t *state)
{
  input_t input; /* was A */

  assert(state != NULL);

  if (state->in_solitary || state->morale_exhausted)
    return; /* Don't allow input. */

  if (state->vischars[0].flags & (vischar_FLAGS_PICKING_LOCK | vischar_FLAGS_CUTTING_WIRE))
  {
    /* Hero is picking a lock, or cutting through a wire fence. */

    /* Postpone automatic control for 31 turns. */
    state->automatic_player_counter = 31;

    if (state->vischars[0].flags == vischar_FLAGS_PICKING_LOCK)
      picking_lock(state);
    else
      cutting_wire(state);

    return;
  }

  input = input_routine(state);
  if (input == input_NONE)
  {
    /* No input */

    if (state->automatic_player_counter == 0)
      return;

    /* No player input: count down. */
    state->automatic_player_counter--;
    input = input_NONE;
  }
  else
  {
    /* Input received */

    /* Postpone automatic control for 31 turns. */
    state->automatic_player_counter = 31;

    if (state->hero_in_bed || state->hero_in_breakfast)
    {
//      printf("hero at breakfast %d\n", state->hero_in_breakfast);
//      printf("hero in bed %d\n", state->hero_in_bed);

      assert(state->hero_in_bed == 0 || state->hero_in_breakfast == 0);

      if (state->hero_in_bed == 0)
      {
        /* Hero was at breakfast. */
        state->vischars[0].route.index = routeindex_43_7833;
        state->vischars[0].route.step  = 0;
        state->vischars[0].mi.mappos.u = 52;
        state->vischars[0].mi.mappos.v = 62;
        set_roomdef(state,
                    room_25_MESS_HALL,
                    roomdef_25_BENCH_G,
                    interiorobject_EMPTY_BENCH);
        state->hero_in_breakfast = 0;
      }
      else
      {
        /* Hero was in bed. */
        state->vischars[0].route.index = routeindex_44_HUT2_RIGHT_TO_LEFT;
        state->vischars[0].route.step  = 1;
        state->vischars[0].target.u    = 46;
        state->vischars[0].target.v    = 46;
        state->vischars[0].mi.mappos.u = 46;
        state->vischars[0].mi.mappos.v = 46;
        state->vischars[0].mi.mappos.w = 24;
        set_roomdef(state,
                    room_2_HUT2LEFT,
                    roomdef_2_BED,
                    interiorobject_EMPTY_BED_FACING_SE);
        state->hero_in_bed = 0;
      }

      // FUTURE: replace with call to setup_room_and_plot
      setup_room(state);
      plot_interior_tiles(state);
    }

    if (input >= input_FIRE)
    {
      process_player_input_fire(state, input);
      input = input_KICK;
    }
  }

  /* If input state has changed then kick a sprite update. */
  if (state->vischars[0].input != input)
    state->vischars[0].input = input | input_KICK;
}